

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O0

void LoadActors(void)

{
  bool bVar1;
  PClassActor **ppPVar2;
  char *pcVar3;
  AActor *pAVar4;
  PClassActor *pPVar5;
  char local_38 [8];
  char fmt [20];
  int i_1;
  PClassActor *ti;
  int i;
  cycle_t timer;
  
  cycle_t::Reset((cycle_t *)&stack0xfffffffffffffff0);
  cycle_t::Clock((cycle_t *)&stack0xfffffffffffffff0);
  FScriptPosition::ResetErrorCounter();
  InitThingdef();
  FScriptPosition::StrictErrors = true;
  ParseScripts();
  FScriptPosition::StrictErrors = false;
  ParseAllDecorate();
  FFunctionBuildList::Build(&FunctionBuildList);
  if (0 < FScriptPosition::ErrorCounter) {
    I_Error("%d errors while parsing DECORATE scripts",(ulong)(uint)FScriptPosition::ErrorCounter);
  }
  FScriptPosition::ResetErrorCounter();
  ti._4_4_ = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses);
  while (ti._4_4_ = ti._4_4_ - 1, -1 < (int)ti._4_4_) {
    ppPVar2 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                        (&PClassActor::AllActorClasses,(long)(int)ti._4_4_);
    unique0x00012000 = *ppPVar2;
    if (*(int *)((long)&(unique0x00012000->super_PClass).super_PNativeStruct.super_PStruct.
                        super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
                        super_DObject + 0x24) == -1) {
      if ((*(uint32 *)
            ((long)&(unique0x00012000->super_PClass).super_PNativeStruct.super_PStruct.
                    super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.super_DObject +
            0x20) & 0x800) == 0) {
        pcVar3 = FName::GetChars(&(unique0x00012000->super_PClass).super_PNativeStruct.super_PStruct
                                  .super_PNamedType.TypeName);
        Printf("\x1cGClass %s referenced but not defined\n",pcVar3);
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
      }
      else {
        pcVar3 = FName::GetChars(&(unique0x00012000->super_PClass).super_PNativeStruct.super_PStruct
                                  .super_PNamedType.TypeName);
        Printf("\x1cIClass %s referenced but not defined\n",pcVar3);
        FScriptPosition::WarnCounter = FScriptPosition::WarnCounter + 1;
        DObject::StaticPointerSubstitution((DObject *)stack0xffffffffffffffe0,(DObject *)0x0,false);
        TArray<PClassActor_*,_PClassActor_*>::Delete(&PClassActor::AllActorClasses,ti._4_4_);
      }
    }
    else {
      pAVar4 = GetDefaultByType(&unique0x00012000->super_PClass);
      if (pAVar4 == (AActor *)0x0) {
        pcVar3 = FName::GetChars(&(stack0xffffffffffffffe0->super_PClass).super_PNativeStruct.
                                  super_PStruct.super_PNamedType.TypeName);
        Printf("\x1cGNo ActorInfo defined for class \'%s\'\n",pcVar3);
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
      }
      else {
        CheckStates(stack0xffffffffffffffe0);
        if ((((stack0xffffffffffffffe0->super_PClass).bDecorateClass & 1U) != 0) &&
           (bVar1 = PClass::IsDescendantOf
                              (&stack0xffffffffffffffe0->super_PClass,
                               AStateProvider::RegistrationInfo.MyClass), bVar1)) {
          CheckForUnsafeStates(stack0xffffffffffffffe0);
        }
      }
    }
  }
  if (0 < FScriptPosition::ErrorCounter) {
    I_Error("%d errors during actor postprocessing",(ulong)(uint)FScriptPosition::ErrorCounter);
  }
  cycle_t::Unclock((cycle_t *)&stack0xfffffffffffffff0);
  if ((batchrun & 1U) == 0) {
    cycle_t::TimeMS((cycle_t *)&stack0xfffffffffffffff0);
    Printf("script parsing took %.2f ms\n");
  }
  fmt[0xc] = '\0';
  fmt[0xd] = '\0';
  fmt[0xe] = '\0';
  fmt[0xf] = '\0';
  for (; (int)fmt._12_4_ < 0x1f; fmt._12_4_ = fmt._12_4_ + 1) {
    mysnprintf(local_38,0x14,"QuestItem%d",(ulong)(fmt._12_4_ + 1));
    pPVar5 = PClass::FindActor(local_38);
    QuestItemClasses[(int)fmt._12_4_] = pPVar5;
  }
  TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>::Clear
            (&StateSourceLines,1);
  return;
}

Assistant:

void LoadActors()
{
	cycle_t timer;

	timer.Reset(); timer.Clock();
	FScriptPosition::ResetErrorCounter();

	InitThingdef();
	FScriptPosition::StrictErrors = true;
	ParseScripts();

	FScriptPosition::StrictErrors = false;
	ParseAllDecorate();

	FunctionBuildList.Build();

	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors while parsing DECORATE scripts", FScriptPosition::ErrorCounter);
	}
	FScriptPosition::ResetErrorCounter();

	for (int i = PClassActor::AllActorClasses.Size() - 1; i >= 0; i--)
	{
		auto ti = PClassActor::AllActorClasses[i];
		if (ti->Size == TentativeClass)
		{
			if (ti->ObjectFlags & OF_Transient)
			{
				Printf(TEXTCOLOR_ORANGE "Class %s referenced but not defined\n", ti->TypeName.GetChars());
				FScriptPosition::WarnCounter++;
				DObject::StaticPointerSubstitution(ti, nullptr);
				PClassActor::AllActorClasses.Delete(i);
			}
			else
			{
				Printf(TEXTCOLOR_RED "Class %s referenced but not defined\n", ti->TypeName.GetChars());
				FScriptPosition::ErrorCounter++;
			}
			continue;
		}

		if (GetDefaultByType(ti) == nullptr)
		{
			Printf(TEXTCOLOR_RED "No ActorInfo defined for class '%s'\n", ti->TypeName.GetChars());
			FScriptPosition::ErrorCounter++;
			continue;
		}


		CheckStates(ti);

		if (ti->bDecorateClass && ti->IsDescendantOf(RUNTIME_CLASS(AStateProvider)))
		{
			// either a DECORATE based weapon or CustomInventory. 
			// These are subject to relaxed rules for user variables in states.
			// Although there is a runtime check for bogus states, let's do a quick analysis if any of the known entry points
			// hits an unsafe state. If we can find something here it can be handled wuth a compile error rather than a runtime error.
			CheckForUnsafeStates(ti);
		}

	}
	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors during actor postprocessing", FScriptPosition::ErrorCounter);
	}

	timer.Unclock();
	if (!batchrun) Printf("script parsing took %.2f ms\n", timer.TimeMS());

	// Since these are defined in DECORATE now the table has to be initialized here.
	for (int i = 0; i < 31; i++)
	{
		char fmt[20];
		mysnprintf(fmt, countof(fmt), "QuestItem%d", i + 1);
		QuestItemClasses[i] = PClass::FindActor(fmt);
	}
	StateSourceLines.Clear();
}